

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int __thiscall ON_String::ReverseFind(ON_String *this,char *s)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *local_38;
  char *p;
  char *p0;
  int s_len;
  int rc;
  char *s_local;
  ON_String *this_local;
  
  if (((s != (char *)0x0) && (*s != '\0')) && (bVar2 = IsEmpty(this), !bVar2)) {
    for (p0._0_4_ = 0; s[(int)p0] != '\0'; p0._0_4_ = (int)p0 + 1) {
    }
    iVar3 = Length(this);
    if ((int)p0 <= iVar3) {
      pcVar1 = this->m_s;
      iVar3 = Length(this);
      for (local_38 = pcVar1 + (iVar3 - (int)p0); pcVar1 <= local_38; local_38 = local_38 + -1) {
        iVar3 = strncmp(local_38,s,(long)(int)p0);
        if (iVar3 == 0) {
          return (int)local_38 - (int)pcVar1;
        }
      }
    }
  }
  return -1;
}

Assistant:

int ON_String::ReverseFind(const char* s) const
{
  int rc = -1;
  if (s && s[0] && !IsEmpty()) 
  {
    int s_len = 0;
    while (0 != s[s_len])
      s_len++;
    if (Length() >= s_len)
    {
      const char* p0 = m_s;
      const char* p = p0 + (Length()-s_len);
      while (p >= p0)
      {
        if (0 == strncmp(p, s, s_len))
          return ((int)(p - p0));
        p--;
      }
    }
  }
  return rc;
}